

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi_info(char *filename,int *x,int *y,int *comp)

{
  FILE *__stream;
  int result;
  FILE *f;
  int *in_stack_000000b8;
  int *in_stack_000000c0;
  int *in_stack_000000c8;
  FILE *in_stack_000000d0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  int local_4;
  
  __stream = (FILE *)stbi__fopen(in_stack_ffffffffffffffd0,
                                 (char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                  in_stack_ffffffffffffffc8));
  if (__stream == (FILE *)0x0) {
    local_4 = stbi__err("Unable to open file");
  }
  else {
    local_4 = stbi_info_from_file(in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,
                                  in_stack_000000b8);
    fclose(__stream);
  }
  return local_4;
}

Assistant:

STBIDEF int stbi_info(char const *filename, int *x, int *y, int *comp)
{
    FILE *f = stbi__fopen(filename, "rb");
    int result;
    if (!f) return stbi__err("can't fopen", "Unable to open file");
    result = stbi_info_from_file(f, x, y, comp);
    fclose(f);
    return result;
}